

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O1

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::CatalogSetSecretStorage::StoreSecret
          (CatalogSetSecretStorage *this,
          unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
          *secret,OnCreateConflict on_conflict,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  byte bVar1;
  char cVar2;
  pointer pcVar3;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  CatalogTransaction transaction_02;
  CatalogTransaction transaction_03;
  _Head_base<0UL,_duckdb::SecretEntry_*,_false> _Var4;
  pointer pCVar5;
  pointer pBVar6;
  optional_ptr<duckdb::CatalogEntry,_true> oVar7;
  type pBVar8;
  Catalog *catalog;
  SecretCatalogEntry *this_00;
  pointer pSVar9;
  pointer pSVar10;
  type other;
  SecretEntry *this_01;
  ulong uVar11;
  long *plVar12;
  InternalException *this_02;
  InvalidInputException *this_03;
  size_type *psVar13;
  undefined7 in_register_00000011;
  unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true> *puVar14
  ;
  char *pcVar15;
  optional_ptr<duckdb::CatalogTransaction,_true> in_R8;
  string secret_name;
  templated_unique_single_t secret_entry;
  LogicalDependencyList l;
  _Head_base<0UL,_duckdb::SecretCatalogEntry_*,_false> local_1e8;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  _Head_base<0UL,_duckdb::SecretEntry_*,_false> local_1a0;
  unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
  *local_198;
  optional_ptr<duckdb::CatalogTransaction,_true> local_190;
  undefined1 local_188 [32];
  float local_168;
  size_t local_160;
  __node_base_ptr p_Stack_158;
  undefined1 local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Val local_d0;
  undefined8 local_c0;
  undefined8 uStack_b8;
  transaction_t local_b0;
  CatalogTransaction local_a8;
  CatalogTransaction local_80;
  CatalogTransaction local_58;
  
  puVar14 = (unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
             *)CONCAT71(in_register_00000011,on_conflict);
  local_198 = secret + 7;
  local_1a0._M_head_impl = (SecretEntry *)this;
  pCVar5 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                       *)local_198);
  local_190.ptr = in_R8.ptr;
  GetTransactionOrDefault(&local_58,(CatalogSetSecretStorage *)secret,in_R8);
  pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(puVar14);
  transaction_00.context.ptr = local_58.context.ptr;
  transaction_00.db.ptr = local_58.db.ptr;
  transaction_00.transaction.ptr = local_58.transaction.ptr;
  transaction_00.transaction_id = local_58.transaction_id;
  transaction_00.start_time = local_58.start_time;
  oVar7 = CatalogSet::GetEntry(pCVar5,transaction_00,&pBVar6->name);
  if (oVar7.ptr != (CatalogEntry *)0x0) {
    switch((ulong)transaction.ptr & 0xff) {
    case 0:
      uVar11 = (ulong)*(byte *)&secret[6].
                                super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                                ._M_t.
                                super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                                .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>.
                                _M_head_impl;
      pcVar15 = "Temporary";
      if (uVar11 != 0) {
        pcVar15 = "Persistent";
      }
      local_188._0_8_ = (long)local_188 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_188,pcVar15,pcVar15 + uVar11 + 9);
      cVar2 = *(char *)&secret[6].
                        super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                        ._M_t.
                        super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                        .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
      if (cVar2 == '\x01') {
        ::std::operator+(&local_1c0," in secret storage \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (secret + 1));
        plVar12 = (long *)::std::__cxx11::string::append((char *)&local_1c0);
        local_1e0._M_dataplus._M_p = (pointer)*plVar12;
        psVar13 = (size_type *)(plVar12 + 2);
        if ((size_type *)local_1e0._M_dataplus._M_p == psVar13) {
          local_1e0.field_2._M_allocated_capacity = *psVar13;
          local_1e0.field_2._8_8_ = plVar12[3];
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        }
        else {
          local_1e0.field_2._M_allocated_capacity = *psVar13;
        }
        local_1e0._M_string_length = plVar12[1];
        *plVar12 = (long)psVar13;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
      }
      else {
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,anon_var_dwarf_643533f + 9);
      }
      if ((cVar2 != '\0') &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2)) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      this_03 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_150._0_8_ = local_150 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,"%s secret with name \'%s\' already exists%s!","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_188._0_8_,(pointer)(local_188._0_8_ + local_188._8_8_));
      pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(puVar14);
      local_110._M_allocated_capacity = (size_type)local_100;
      pcVar3 = (pBVar6->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,pcVar3 + (pBVar6->name)._M_string_length);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_1e0._M_dataplus._M_p,
                 local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
      InvalidInputException::
      InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this_03,(string *)local_150,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110,
                 &local_130);
      __cxa_throw(this_03,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    case 1:
      *(undefined8 *)local_1a0._M_head_impl = 0;
      return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>)
             local_1a0._M_head_impl;
    case 2:
      pCVar5 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
               operator->((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                           *)local_198);
      GetTransactionOrDefault(&local_80,(CatalogSetSecretStorage *)secret,local_190);
      pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(puVar14);
      transaction_01.context.ptr = local_80.context.ptr;
      transaction_01.db.ptr = local_80.db.ptr;
      transaction_01.transaction.ptr = local_80.transaction.ptr;
      transaction_01.transaction_id = local_80.transaction_id;
      transaction_01.start_time = local_80.start_time;
      CatalogSet::DropEntry(pCVar5,transaction_01,&pBVar6->name,true,true);
      break;
    case 3:
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_188._0_8_ = (long)local_188 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_188,"unknown OnCreateConflict found while registering secret","");
      InternalException::InternalException(this_02,(string *)local_188);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pBVar8 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator*(puVar14);
  (*(code *)(((secret->
              super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
              )._M_t.
              super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
              .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl)->provider).
            field_2._M_allocated_capacity)(secret,pBVar8,(ulong)transaction.ptr & 0xff);
  pBVar6 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(puVar14);
  pcVar3 = (pBVar6->name)._M_dataplus._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,pcVar3 + (pBVar6->name)._M_string_length);
  catalog = Catalog::GetSystemCatalog
                      ((DatabaseInstance *)
                       secret[8].
                       super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                       ._M_t.
                       super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                       .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl);
  this_00 = (SecretCatalogEntry *)operator_new(0xe8);
  local_188._0_8_ =
       (puVar14->
       super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>).
       _M_t.
       super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
       .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
  (puVar14->
  super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>)._M_t.
  super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>.
  _M_t.
  super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
  .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl = (BaseSecret *)0x0;
  SecretCatalogEntry::SecretCatalogEntry
            (this_00,(unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
                      *)local_188,catalog);
  local_1c0._M_dataplus._M_p = (pointer)this_00;
  if ((_Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>)
      local_188._0_8_ != (BaseSecret *)0x0) {
    (*(*(_func_int ***)local_188._0_8_)[1])();
  }
  bVar1 = *(byte *)&secret[6].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
  pSVar9 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                         *)&local_1c0);
  puVar14 = local_198;
  (pSVar9->super_InCatalogEntry).super_CatalogEntry.temporary = (bool)(bVar1 ^ 1);
  pSVar9 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                         *)&local_1c0);
  pSVar10 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
            operator->(&pSVar9->secret);
  ::std::__cxx11::string::_M_assign((string *)&pSVar10->storage_mode);
  cVar2 = *(char *)&secret[6].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
  pSVar9 = unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::SecretCatalogEntry,_std::default_delete<duckdb::SecretCatalogEntry>,_true>
                         *)&local_1c0);
  pSVar10 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
            operator->(&pSVar9->secret);
  pSVar10->persist_type = cVar2 + TEMPORARY;
  local_188._0_8_ = &p_Stack_158;
  local_188._8_8_ = 1;
  local_188._16_8_ = (_Hash_node_base *)0x0;
  local_188._24_8_ = 0;
  local_168 = 1.0;
  local_160 = 0;
  p_Stack_158 = (__node_base_ptr)0x0;
  pCVar5 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                       *)puVar14);
  GetTransactionOrDefault(&local_a8,(CatalogSetSecretStorage *)secret,local_190);
  local_1e8._M_head_impl = (SecretCatalogEntry *)local_1c0._M_dataplus._M_p;
  local_1c0._M_dataplus._M_p = (pointer)0x0;
  transaction_02.context.ptr = local_a8.context.ptr;
  transaction_02.db.ptr = local_a8.db.ptr;
  transaction_02.transaction.ptr = local_a8.transaction.ptr;
  transaction_02.transaction_id = local_a8.transaction_id;
  transaction_02.start_time = local_a8.start_time;
  CatalogSet::CreateEntry
            (pCVar5,transaction_02,&local_1e0,
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
             &local_1e8,(LogicalDependencyList *)local_188);
  if (local_1e8._M_head_impl != (SecretCatalogEntry *)0x0) {
    (*((local_1e8._M_head_impl)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_1e8._M_head_impl = (SecretCatalogEntry *)0x0;
  pCVar5 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
                       *)puVar14);
  GetTransactionOrDefault
            ((CatalogTransaction *)&local_d0.hugeint,(CatalogSetSecretStorage *)secret,local_190);
  transaction_03.context.ptr = (ClientContext *)local_d0.hugeint.upper;
  transaction_03.db.ptr = (DatabaseInstance *)local_d0.bigint;
  transaction_03.transaction.ptr = (Transaction *)local_c0;
  transaction_03.transaction_id = uStack_b8;
  transaction_03.start_time = local_b0;
  local_150._0_8_ = CatalogSet::GetEntry(pCVar5,transaction_03,&local_1e0);
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)local_150);
  other = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::operator*
                    ((unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>
                      *)(local_150._0_8_ + 0xe0));
  this_01 = (SecretEntry *)operator_new(0x30);
  SecretEntry::SecretEntry(this_01,other);
  _Var4._M_head_impl = local_1a0._M_head_impl;
  *(SecretEntry **)local_1a0._M_head_impl = this_01;
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_188);
  if ((long *)local_1c0._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_1c0._M_dataplus._M_p + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         (__uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         _Var4._M_head_impl;
}

Assistant:

unique_ptr<SecretEntry> CatalogSetSecretStorage::StoreSecret(unique_ptr<const BaseSecret> secret,
                                                             OnCreateConflict on_conflict,
                                                             optional_ptr<CatalogTransaction> transaction) {
	if (secrets->GetEntry(GetTransactionOrDefault(transaction), secret->GetName())) {
		if (on_conflict == OnCreateConflict::ERROR_ON_CONFLICT) {
			string persist_string = persistent ? "Persistent" : "Temporary";
			string storage_string = persistent ? " in secret storage '" + storage_name + "'" : "";
			throw InvalidInputException("%s secret with name '%s' already exists%s!", persist_string, secret->GetName(),
			                            storage_string);
		} else if (on_conflict == OnCreateConflict::IGNORE_ON_CONFLICT) {
			return nullptr;
		} else if (on_conflict == OnCreateConflict::ALTER_ON_CONFLICT) {
			throw InternalException("unknown OnCreateConflict found while registering secret");
		} else if (on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
			secrets->DropEntry(GetTransactionOrDefault(transaction), secret->GetName(), true, true);
		}
	}

	// Call write function
	WriteSecret(*secret, on_conflict);

	auto secret_name = secret->GetName();
	auto secret_entry = make_uniq<SecretCatalogEntry>(std::move(secret), Catalog::GetSystemCatalog(db));
	secret_entry->temporary = !persistent;
	secret_entry->secret->storage_mode = storage_name;
	secret_entry->secret->persist_type = persistent ? SecretPersistType::PERSISTENT : SecretPersistType::TEMPORARY;
	LogicalDependencyList l;
	secrets->CreateEntry(GetTransactionOrDefault(transaction), secret_name, std::move(secret_entry), l);

	auto secret_catalog_entry =
	    &secrets->GetEntry(GetTransactionOrDefault(transaction), secret_name)->Cast<SecretCatalogEntry>();
	return make_uniq<SecretEntry>(*secret_catalog_entry->secret);
}